

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::SnapEdge(S2Builder *this,InputEdgeId e,vector<int,_std::allocator<int>_> *chain)

{
  value_type *this_00;
  InputEdge *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  ostream *poVar7;
  size_type sVar8;
  reference piVar9;
  S2Point *b_00;
  iterator iStack_188;
  SiteId id;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int local_15c;
  const_iterator pvStack_158;
  SiteId site_id_1;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  S2LogMessage local_138;
  S2LogMessageVoidify local_125;
  int local_124;
  S1ChordAngle SStack_120;
  int xyb;
  double local_118;
  S1ChordAngle local_110;
  S1ChordAngle ac;
  undefined1 local_100 [8];
  S2Point a;
  S2LogMessage local_d0;
  S2LogMessageVoidify local_b9;
  double local_b8;
  Excluded local_ac;
  S1ChordAngle SStack_a8;
  Excluded result;
  double local_a0;
  S1ChordAngle local_98;
  S1ChordAngle bc;
  S2Point b;
  bool add_site_c;
  S2Point *c;
  const_iterator pvStack_58;
  SiteId site_id;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  value_type *candidates;
  S2Point *y;
  S2Point *x;
  InputEdge *edge;
  vector<int,_std::allocator<int>_> *chain_local;
  S2Builder *pSStack_10;
  InputEdgeId e_local;
  S2Builder *this_local;
  
  edge = (InputEdge *)chain;
  chain_local._4_4_ = e;
  pSStack_10 = this;
  std::vector<int,_std::allocator<int>_>::clear(chain);
  x = (S2Point *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                (&this->input_edges_,(long)chain_local._4_4_);
  if ((this->snapping_needed_ & 1U) == 0) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)edge,(value_type_conflict1 *)x);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)edge,(value_type_conflict1 *)((long)x->c_ + 4));
  }
  else {
    y = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (&this->input_vertices_,(long)((const_reference)x)->first);
    candidates = (value_type *)
                 std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                           (&this->input_vertices_,(long)*(int *)((long)x->c_ + 4));
    __begin1 = (const_iterator)
               std::
               vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ::operator[](&this->edge_sites_,(long)chain_local._4_4_);
    __range1 = (value_type *)__begin1;
    __end1 = gtl::compact_array_base<int,_std::allocator<int>_>::begin
                       ((compact_array_base<int,_std::allocator<int>_> *)__begin1);
    pvStack_58 = gtl::compact_array_base<int,_std::allocator<int>_>::end
                           ((compact_array_base<int,_std::allocator<int>_> *)__begin1);
    for (; __end1 != pvStack_58; __end1 = __end1 + 1) {
      c._4_4_ = *__end1;
      pvVar4 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                         (&this->sites_,(long)c._4_4_);
      iVar3 = s2pred::CompareEdgeDistance
                        (pvVar4,y,(S2Point *)candidates,
                         (S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
      if (iVar3 < 1) {
        bVar2 = true;
        while (bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                 ((vector<int,_std::allocator<int>_> *)edge),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)edge);
          pvVar6 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                             (&this->sites_,(long)*pvVar5);
          bc.length2_ = pvVar6->c_[0];
          S1ChordAngle::S1ChordAngle(&local_98,(S2Point *)&bc,pvVar4);
          local_a0 = local_98.length2_;
          SStack_a8.length2_ = (this->max_adjacent_site_separation_ca_).length2_;
          bVar1 = operator>=(local_98,SStack_a8);
          if (bVar1) break;
          local_b8 = (this->edge_snap_radius_ca_).length2_;
          local_ac = s2pred::GetVoronoiSiteExclusion
                               ((S2Point *)&bc,pvVar4,y,(S2Point *)candidates,(S1ChordAngle)local_b8
                               );
          if (local_ac != FIRST) {
            if (local_ac == SECOND) {
              bVar2 = false;
              break;
            }
            if (local_ac != NEITHER) {
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_d0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                         ,0x3ee,kFatal,(ostream *)&std::cerr);
              poVar7 = S2LogMessage::stream(&local_d0);
              poVar7 = std::operator<<(poVar7,
                                       "Check failed: (s2pred::Excluded::NEITHER) == (result) ");
              S2LogMessageVoidify::operator&(&local_b9,poVar7);
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d0);
            }
            sVar8 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)edge);
            if (sVar8 < 2) break;
            ac.length2_ = (double)std::vector<int,_std::allocator<int>_>::end
                                            ((vector<int,_std::allocator<int>_> *)edge);
            piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&ac,-2);
            pvVar6 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                               (&this->sites_,(long)*piVar9);
            local_100 = (undefined1  [8])pvVar6->c_[0];
            a.c_[0] = pvVar6->c_[1];
            a.c_[1] = pvVar6->c_[2];
            S1ChordAngle::S1ChordAngle(&local_110,(S2Point *)local_100,pvVar4);
            local_118 = local_110.length2_;
            SStack_120.length2_ = (this->max_adjacent_site_separation_ca_).length2_;
            bVar1 = operator>=(local_110,SStack_120);
            if (bVar1) break;
            local_124 = s2pred::Sign(y,(S2Point *)candidates,(S2Point *)&bc);
            iVar3 = s2pred::Sign((S2Point *)local_100,(S2Point *)&bc,pvVar4);
            if ((iVar3 == local_124) ||
               (iVar3 = s2pred::EdgeCircumcenterSign
                                  (y,(S2Point *)candidates,(S2Point *)local_100,(S2Point *)&bc,
                                   pvVar4), iVar3 != local_124)) break;
          }
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)edge);
        }
        if (bVar2) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)edge,
                     (value_type_conflict1 *)((long)&c + 4));
        }
      }
    }
    bVar2 = std::vector<int,_std::allocator<int>_>::empty((vector<int,_std::allocator<int>_> *)edge)
    ;
    __range2._7_1_ = 0;
    if (bVar2) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_138,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x409,kFatal,(ostream *)&std::cerr);
      __range2._7_1_ = 1;
      poVar7 = S2LogMessage::stream(&local_138);
      poVar7 = std::operator<<(poVar7,"Check failed: !chain->empty() ");
      S2LogMessageVoidify::operator&(&local_125,poVar7);
    }
    if ((__range2._7_1_ & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_138);
    }
    __begin2 = (const_iterator)__range1;
    __end2 = gtl::compact_array_base<int,_std::allocator<int>_>::begin
                       (&__range1->super_compact_array_base<int,_std::allocator<int>_>);
    pvStack_158 = gtl::compact_array_base<int,_std::allocator<int>_>::end
                            ((compact_array_base<int,_std::allocator<int>_> *)__begin2);
    for (; this_00 = candidates, __end2 != pvStack_158; __end2 = __end2 + 1) {
      local_15c = *__end2;
      b_00 = (S2Point *)candidates;
      pvVar5 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)edge);
      pvVar4 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                         (&this->sites_,(long)*pvVar5);
      pvVar6 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                         (&this->sites_,(long)local_15c);
      iVar3 = s2pred::CompareDistances((s2pred *)this_00,pvVar4,pvVar6,b_00);
      if (0 < iVar3) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&__range2_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x40e,kError,(ostream *)&std::cerr);
        poVar7 = S2LogMessage::stream((S2LogMessage *)&__range2_1);
        std::operator<<(poVar7,"Snapping invariant broken!");
        S2LogMessage::~S2LogMessage((S2LogMessage *)&__range2_1);
      }
    }
    if ((s2builder_verbose & 1U) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)x->c_);
      poVar7 = std::operator<<(poVar7,",");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)((long)x->c_ + 4));
      std::operator<<(poVar7,"): ");
      this_01 = edge;
      __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)edge);
      iStack_188 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)this_01);
      while (bVar2 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffe78), bVar2) {
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2_1);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*piVar9);
        std::operator<<(poVar7," ");
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_1);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void S2Builder::SnapEdge(InputEdgeId e, vector<SiteId>* chain) const {
  chain->clear();
  const InputEdge& edge = input_edges_[e];
  if (!snapping_needed_) {
    chain->push_back(edge.first);
    chain->push_back(edge.second);
    return;
  }

  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];

  // Optimization: if there is only one nearby site, return.
  // Optimization: if there are exactly two nearby sites, and one is close
  // enough to each vertex, then return.

  // Now iterate through the sites.  We keep track of the sequence of sites
  // that are visited.
  const auto& candidates = edge_sites_[e];
  for (SiteId site_id : candidates) {
    const S2Point& c = sites_[site_id];
    // Skip any sites that are too far away.  (There will be some of these,
    // because we also keep track of "sites to avoid".)  Note that some sites
    // may be close enough to the line containing the edge, but not to the
    // edge itself, so we can just use the dot product with the edge normal.
    if (s2pred::CompareEdgeDistance(c, x, y, edge_snap_radius_ca_) > 0) {
      continue;
    }
    // Check whether the new site C excludes the previous site B.  If so,
    // repeat with the previous site, and so on.
    bool add_site_c = true;
    for (; !chain->empty(); chain->pop_back()) {
      S2Point b = sites_[chain->back()];

      // First, check whether B and C are so far apart that their clipped
      // Voronoi regions can't intersect.
      S1ChordAngle bc(b, c);
      if (bc >= max_adjacent_site_separation_ca_) break;

      // Otherwise, we want to check whether site C prevents the Voronoi
      // region of B from intersecting XY, or vice versa.  This can be
      // determined by computing the "coverage interval" (the segment of XY
      // intersected by the coverage disc of radius snap_radius) for each
      // site.  If the coverage interval of one site contains the coverage
      // interval of the other, then the contained site can be excluded.
      s2pred::Excluded result = s2pred::GetVoronoiSiteExclusion(
          b, c, x, y, edge_snap_radius_ca_);
      if (result == s2pred::Excluded::FIRST) continue;  // Site B excluded by C
      if (result == s2pred::Excluded::SECOND) {
        add_site_c = false;  // Site C is excluded by B.
        break;
      }
      S2_DCHECK_EQ(s2pred::Excluded::NEITHER, result);

      // Otherwise check whether the previous site A is close enough to B and
      // C that it might further clip the Voronoi region of B.
      if (chain->size() < 2) break;
      S2Point a = sites_[chain->end()[-2]];
      S1ChordAngle ac(a, c);
      if (ac >= max_adjacent_site_separation_ca_) break;

      // If triangles ABC and XYB have the same orientation, the circumcenter
      // Z of ABC is guaranteed to be on the same side of XY as B.
      int xyb = s2pred::Sign(x, y, b);
      if (s2pred::Sign(a, b, c) == xyb) {
        break;  // The circumcenter is on the same side as B but further away.
      }
      // Other possible optimizations:
      //  - if AB > max_adjacent_site_separation_ca_ then keep B.
      //  - if d(B, XY) < 0.5 * min(AB, BC) then keep B.

      // If the circumcenter of ABC is on the same side of XY as B, then B is
      // excluded by A and C combined.  Otherwise B is needed and we can exit.
      if (s2pred::EdgeCircumcenterSign(x, y, a, b, c) != xyb) break;
    }
    if (add_site_c) {
      chain->push_back(site_id);
    }
  }
  S2_DCHECK(!chain->empty());
  if (google::DEBUG_MODE) {
    for (SiteId site_id : candidates) {
      if (s2pred::CompareDistances(y, sites_[chain->back()],
                                   sites_[site_id]) > 0) {
        S2_LOG(ERROR) << "Snapping invariant broken!";
      }
    }
  }
  if (s2builder_verbose) {
    std::cout << "(" << edge.first << "," << edge.second << "): ";
    for (SiteId id : *chain) std::cout << id << " ";
    std::cout << std::endl;
  }
}